

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

bool load_labels(char *filename,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  size_type sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  undefined8 in_RDI;
  string line;
  ifstream file_in;
  undefined7 in_stack_fffffffffffffda8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdb0;
  long local_220 [65];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::ifstream::ifstream(local_220,in_RDI,8);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffdb0);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_220,(string *)&stack0xfffffffffffffdb0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffdb0,(value_type *)CONCAT17(bVar1,in_stack_fffffffffffffda8))
      ;
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_18);
    if (sVar4 != 0x50) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/yolo/yolov3-tiny.cpp"
                 ,0xb2,"GGML_ASSERT(%s) failed","labels.size() == 80");
    }
    local_1 = 1;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  }
  else {
    local_1 = 0;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

static bool load_labels(const char * filename, std::vector<std::string> & labels)
{
    std::ifstream file_in(filename);
    if (!file_in) {
        return false;
    }
    std::string line;
    while (std::getline(file_in, line)) {
        labels.push_back(line);
    }
    GGML_ASSERT(labels.size() == 80);
    return true;
}